

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

bool __thiscall S2LatLngRect::Intersects(S2LatLngRect *this,S2LatLngRect *other)

{
  double dVar1;
  bool bVar2;
  S2LatLngRect *pSVar3;
  double dVar4;
  
  dVar1 = (this->lat_).bounds_.c_[0];
  dVar4 = (other->lat_).bounds_.c_[0];
  if (dVar1 <= dVar4) {
    pSVar3 = other;
    if ((this->lat_).bounds_.c_[1] < dVar4) {
      return false;
    }
  }
  else {
    pSVar3 = this;
    dVar4 = dVar1;
    if ((other->lat_).bounds_.c_[1] < dVar1) {
      return false;
    }
  }
  if ((pSVar3->lat_).bounds_.c_[1] < dVar4) {
    return false;
  }
  bVar2 = S1Interval::Intersects(&this->lng_,&other->lng_);
  return bVar2;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }